

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

void __thiscall
cnn::LookupParameters::LookupParameters(LookupParameters *this,uint n,Dim *d,float scale)

{
  _func_int **pp_Var1;
  _func_int **pp_Var2;
  _func_int **pp_Var3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  uint uVar7;
  reference pvVar8;
  float *pfVar9;
  undefined8 *in_RDX;
  uint in_ESI;
  ParametersBase *in_RDI;
  float in_XMM0_Da;
  value_type *g;
  value_type *v;
  uint i;
  Tensor *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  uint in_stack_ffffffffffffff5c;
  AlignedMemoryPool<6U> *in_stack_ffffffffffffff60;
  size_type in_stack_ffffffffffffff68;
  Tensor *pTVar10;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  uint local_34;
  real scale_00;
  
  ParametersBase::ParametersBase(in_RDI);
  in_RDI->_vptr_ParametersBase = (_func_int **)&PTR_scale_parameters_00564588;
  *(undefined4 *)&in_RDI[5]._vptr_ParametersBase = *(undefined4 *)(in_RDX + 4);
  pp_Var1 = (_func_int **)in_RDX[1];
  pp_Var2 = (_func_int **)in_RDX[2];
  pp_Var3 = (_func_int **)in_RDX[3];
  in_RDI[1]._vptr_ParametersBase = (_func_int **)*in_RDX;
  in_RDI[2]._vptr_ParametersBase = pp_Var1;
  in_RDI[3]._vptr_ParametersBase = pp_Var2;
  in_RDI[4]._vptr_ParametersBase = pp_Var3;
  std::allocator<cnn::Tensor>::allocator((allocator<cnn::Tensor> *)0x35b0dd);
  std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::vector
            ((vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),in_stack_ffffffffffffff68
             ,(allocator_type *)in_stack_ffffffffffffff60);
  std::allocator<cnn::Tensor>::~allocator((allocator<cnn::Tensor> *)0x35b100);
  std::allocator<cnn::Tensor>::allocator((allocator<cnn::Tensor> *)0x35b12c);
  std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::vector
            ((vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)
             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),in_stack_ffffffffffffff68
             ,(allocator_type *)in_stack_ffffffffffffff60);
  std::allocator<cnn::Tensor>::~allocator((allocator<cnn::Tensor> *)0x35b14f);
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)0x35b162);
  for (local_34 = 0; local_34 < in_ESI; local_34 = local_34 + 1) {
    pvVar8 = std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::operator[]
                       ((vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)(in_RDI + 6),
                        (ulong)local_34);
    (pvVar8->d).bd = *(uint *)(in_RDX + 4);
    uVar4 = in_RDX[1];
    uVar5 = in_RDX[2];
    uVar6 = in_RDX[3];
    *(undefined8 *)(pvVar8->d).d = *in_RDX;
    *(undefined8 *)((pvVar8->d).d + 2) = uVar4;
    *(undefined8 *)((pvVar8->d).d + 4) = uVar5;
    *(undefined8 *)((pvVar8->d).d + 6) = uVar6;
    pTVar10 = ps;
    uVar7 = Dim::size(&in_stack_ffffffffffffff50->d);
    scale_00 = (real)((ulong)pTVar10 >> 0x20);
    in_stack_ffffffffffffff60 =
         (AlignedMemoryPool<6U> *)
         AlignedMemoryPool<6U>::allocate
                   (in_stack_ffffffffffffff60,
                    CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    pvVar8->v = (float *)in_stack_ffffffffffffff60;
    if ((in_XMM0_Da != 0.0) || (NAN(in_XMM0_Da))) {
      TensorTools::Randomize((Tensor *)CONCAT44(uVar7,in_stack_ffffffffffffff70),scale_00);
    }
    else {
      TensorTools::Randomize(in_stack_ffffffffffffff50);
    }
    pvVar8 = std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::operator[]
                       ((vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)(in_RDI + 9),
                        (ulong)local_34);
    (pvVar8->d).bd = *(uint *)(in_RDX + 4);
    uVar4 = in_RDX[1];
    uVar5 = in_RDX[2];
    uVar6 = in_RDX[3];
    *(undefined8 *)(pvVar8->d).d = *in_RDX;
    *(undefined8 *)((pvVar8->d).d + 2) = uVar4;
    *(undefined8 *)((pvVar8->d).d + 4) = uVar5;
    *(undefined8 *)((pvVar8->d).d + 6) = uVar6;
    in_stack_ffffffffffffff50 = ps;
    in_stack_ffffffffffffff5c = Dim::size(&ps->d);
    pfVar9 = (float *)AlignedMemoryPool<6U>::allocate
                                (in_stack_ffffffffffffff60,
                                 CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    pvVar8->v = pfVar9;
    TensorTools::Zero((Tensor *)0x35b352);
  }
  return;
}

Assistant:

LookupParameters::LookupParameters(unsigned n, const Dim& d, float scale) : dim(d), values(n), grads(n) {
  for (unsigned i = 0; i < n; ++i) {
    auto& v = values[i];
    v.d = d;
    v.v = static_cast<float*>(ps->allocate(d.size() * sizeof(float)));
    if(scale) TensorTools::Randomize(v,scale);
    else TensorTools::Randomize(v);

    auto& g = grads[i];
    g.d = d;
    g.v = static_cast<float*>(ps->allocate(d.size() * sizeof(float)));
    TensorTools::Zero(g);
  }
}